

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this)

{
  bool bVar1;
  pointer pCVar2;
  undefined1 local_48 [16];
  const_reverse_iterator i;
  cmMakefile *this_local;
  cmListFileBacktrace *backtrace;
  
  i.current._M_current =
       (__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>
        )(this->StateSnapshot).State;
  cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__,this->StateSnapshot);
  std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::rbegin
            ((vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_> *)
             (local_48 + 8));
  while( true ) {
    std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::rend
              ((vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_> *)
               local_48);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>_>
                             *)(local_48 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>_>
                             *)local_48);
    if (!bVar1) break;
    pCVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>_>
                           *)(local_48 + 8));
    cmListFileBacktrace::Append(__return_storage_ptr__,pCVar2->Context);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>_>
                  *)(local_48 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace() const
{
  cmListFileBacktrace backtrace(this->StateSnapshot);
  for(CallStackType::const_reverse_iterator i = this->CallStack.rbegin();
      i != this->CallStack.rend(); ++i)
    {
    backtrace.Append(*i->Context);
    }
  return backtrace;
}